

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::SetColorEditOptions(ImGuiColorEditFlags flags)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  
  pIVar2 = GImGui;
  uVar3 = flags | 0x100000;
  if ((flags & 0x700000U) != 0) {
    uVar3 = flags;
  }
  uVar1 = uVar3 | 0x800000;
  if ((uVar3 & 0x1800000) != 0) {
    uVar1 = uVar3;
  }
  uVar3 = uVar1 | 0x2000000;
  if ((uVar1 & 0x6000000) != 0) {
    uVar3 = uVar1;
  }
  uVar1 = uVar3 | 0x8000000;
  if ((uVar3 & 0x18000000) != 0) {
    uVar1 = uVar3;
  }
  uVar3 = (uVar1 & 0x700000) - 1;
  if ((uVar1 & 0x700000 ^ uVar3) <= uVar3) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x13e2,"SetColorEditOptions","ImGui ASSERT FAILED: %s",
                "ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DisplayMask)");
  }
  uVar3 = (uVar1 & 0x1800000) - 1;
  if ((uVar1 & 0x1800000 ^ uVar3) <= uVar3) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x13e3,"SetColorEditOptions","ImGui ASSERT FAILED: %s",
                "ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DataTypeMask)");
  }
  uVar3 = (uVar1 & 0x6000000) - 1;
  if ((uVar1 & 0x6000000 ^ uVar3) <= uVar3) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x13e4,"SetColorEditOptions","ImGui ASSERT FAILED: %s",
                "ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)");
  }
  uVar3 = (uVar1 & 0x18000000) - 1;
  if ((uVar1 & 0x18000000 ^ uVar3) <= uVar3) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x13e5,"SetColorEditOptions","ImGui ASSERT FAILED: %s",
                "ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)");
  }
  pIVar2->ColorEditOptions = uVar1;
  return;
}

Assistant:

void ImGui::SetColorEditOptions(ImGuiColorEditFlags flags)
{
    ImGuiContext& g = *GImGui;
    if ((flags & ImGuiColorEditFlags__DisplayMask) == 0)
        flags |= ImGuiColorEditFlags__OptionsDefault & ImGuiColorEditFlags__DisplayMask;
    if ((flags & ImGuiColorEditFlags__DataTypeMask) == 0)
        flags |= ImGuiColorEditFlags__OptionsDefault & ImGuiColorEditFlags__DataTypeMask;
    if ((flags & ImGuiColorEditFlags__PickerMask) == 0)
        flags |= ImGuiColorEditFlags__OptionsDefault & ImGuiColorEditFlags__PickerMask;
    if ((flags & ImGuiColorEditFlags__InputMask) == 0)
        flags |= ImGuiColorEditFlags__OptionsDefault & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DisplayMask));    // Check only 1 option is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DataTypeMask));   // Check only 1 option is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask));     // Check only 1 option is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));      // Check only 1 option is selected
    g.ColorEditOptions = flags;
}